

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O0

int pkey_rsa_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  int *piVar1;
  int iVar2;
  BIGNUM *pBVar3;
  RSA *key;
  RSA_PKEY_CTX *rctx;
  RSA *rsa;
  EVP_PKEY *pkey_local;
  EVP_PKEY_CTX *ctx_local;
  
  piVar1 = (int *)ctx->data;
  if (*(long *)(piVar1 + 2) == 0) {
    pBVar3 = BN_new();
    *(BIGNUM **)(piVar1 + 2) = pBVar3;
    if ((*(long *)(piVar1 + 2) == 0) ||
       (iVar2 = BN_set_word(*(BIGNUM **)(piVar1 + 2),0x10001), iVar2 == 0)) {
      return 0;
    }
  }
  key = (RSA *)RSA_new();
  if (key == (RSA *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    iVar2 = RSA_generate_key_ex((RSA *)key,*piVar1,*(BIGNUM **)(piVar1 + 2),(BN_GENCB *)0x0);
    if (iVar2 == 0) {
      RSA_free((RSA *)key);
      ctx_local._4_4_ = 0;
    }
    else {
      EVP_PKEY_assign_RSA(pkey,key);
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_rsa_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey) {
  RSA *rsa = NULL;
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);

  if (!rctx->pub_exp) {
    rctx->pub_exp = BN_new();
    if (!rctx->pub_exp || !BN_set_word(rctx->pub_exp, RSA_F4)) {
      return 0;
    }
  }
  rsa = RSA_new();
  if (!rsa) {
    return 0;
  }

  if (!RSA_generate_key_ex(rsa, rctx->nbits, rctx->pub_exp, NULL)) {
    RSA_free(rsa);
    return 0;
  }

  EVP_PKEY_assign_RSA(pkey, rsa);
  return 1;
}